

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchEnumType_Test::
~ExtensionDeclarationsTest_MismatchEnumType_Test
          (ExtensionDeclarationsTest_MismatchEnumType_Test *this)

{
  ExtensionDeclarationsTest_MismatchEnumType_Test *this_local;
  
  ~ExtensionDeclarationsTest_MismatchEnumType_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(ExtensionDeclarationsTest, MismatchEnumType) {
  absl::StatusOr<FileDescriptorProto> file_proto = ParameterizeFileProto(
      R"pb(
        name: "foo.proto"
        package: "ext.test"
        message_type {
          name: "Foo"
          extension_range {
            start: 4
            end: 99999
            options: {
              declaration: {
                number: 10
                full_name: ".ext.test.bar"
                type: ".ext.test.Bar"
              }
            }
          }
        }
        enum_type {
          name: "Bar"
          value: { name: "BUZ1" number: 123 }
        }
        enum_type {
          name: "Abc"
          value: { name: "BUZ2" number: 456 }
        }
        extension { extendee: "Foo" name: "bar" number: 10 type_name: "Abc" }
      )pb",
      GetParam());
  ASSERT_OK(file_proto);

  DescriptorPool pool;
  pool.EnforceExtensionDeclarations(ExtDeclEnforcementLevel::kAllExtensions);
  MockErrorCollector error_collector;
  EXPECT_EQ(pool.BuildFileCollectingErrors(*file_proto, &error_collector),
            nullptr);
  EXPECT_EQ(
      error_collector.text_,
      "foo.proto: ext.test.bar: EXTENDEE: \"ext.test.Foo\" extension field 10 "
      "is expected to be type \".ext.test.Bar\", not \".ext.test.Abc\".\n");
}